

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Return(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  long lVar1;
  SQVM *in_RCX;
  SQObjectPtr *this_00;
  long in_RSI;
  long in_RDI;
  SQObjectPtr *dest;
  SQInteger i;
  SQInteger callerbase;
  SQBool _isroot;
  SQInteger in_stack_00000050;
  SQInteger in_stack_00000058;
  SQVM *in_stack_00000060;
  SQVM *this_01;
  byte *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x108) + 0x40);
  this_00 = (SQObjectPtr *)
            (*(long *)(in_RDI + 0x50) - (long)*(int *)(*(long *)(in_RDI + 0x108) + 0x2c));
  if ((*(byte *)(in_RDI + 0x90) & 1) != 0) {
    for (in_stack_ffffffffffffffc8 = (byte *)0x0;
        (long)in_stack_ffffffffffffffc8 < (long)*(int *)(*(long *)(in_RDI + 0x108) + 0x38);
        in_stack_ffffffffffffffc8 =
             (byte *)((long)&(((SQObjectPtr *)in_stack_ffffffffffffffc8)->super_SQObject)._type + 1)
        ) {
      CallDebugHook(in_stack_00000060,in_stack_00000058,in_stack_00000050);
    }
  }
  this_01 = in_RCX;
  if (lVar1 == 0) {
    if (*(int *)(*(long *)(in_RDI + 0x108) + 0x34) == -1) {
      this_01 = (SQVM *)0x0;
    }
    else {
      this_01 = (SQVM *)(*(long *)(in_RDI + 0x30) +
                        ((long)&(this_00->super_SQObject)._type +
                        (long)*(int *)(*(long *)(in_RDI + 0x108) + 0x34)) * 0x10);
    }
  }
  if (this_01 != (SQVM *)0x0) {
    if (in_RSI == 0xff) {
      ::SQObjectPtr::Null((SQObjectPtr *)this_01);
    }
    else {
      ::SQObjectPtr::operator=(this_00,(SQObjectPtr *)in_stack_ffffffffffffffc8);
    }
  }
  LeaveFrame(in_RCX);
  return (bool)(-(lVar1 != 0) & 1);
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;

    if (_debughook) {
        for(SQInteger i=0; i<ci->_ncalls; i++) {
            CallDebugHook(_SC('r'));
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}